

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInfo(void *handle,int net_type,char *tx_hex_string,char **txid,char **wtxid,
                uint32_t *size,uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime
                )

{
  bool bVar1;
  CfdException *this;
  allocator local_12a;
  bool is_bitcoin;
  char *work_wtxid;
  char *work_txid;
  void *local_118;
  string local_110;
  char **local_f0;
  TransactionContext tx;
  
  work_txid = (char *)0x0;
  work_wtxid = (char *)0x0;
  local_118 = handle;
  local_f0 = wtxid;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_110,tx_hex_string,&local_12a);
      cfd::TransactionContext::TransactionContext(&tx,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      cfd::capi::GetTxInfo
                ((AbstractTransaction *)&tx,&work_txid,&work_wtxid,size,vsize,weight,version,
                 locktime);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&local_110,tx_hex_string,&local_12a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      cfd::capi::GetTxInfo
                ((AbstractTransaction *)&tx,&work_txid,&work_wtxid,size,vsize,weight,version,
                 locktime);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx);
    }
    if (work_txid != (char *)0x0) {
      *txid = work_txid;
    }
    if (work_wtxid != (char *)0x0) {
      *local_f0 = work_wtxid;
    }
    return 0;
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4fe2f6;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x987;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7eb8;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_110);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInfo(
    void* handle, int net_type, const char* tx_hex_string, char** txid,
    char** wtxid, uint32_t* size, uint32_t* vsize, uint32_t* weight,
    uint32_t* version, uint32_t* locktime) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid);
  return result;
}